

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lemon.c
# Opt level: O1

void FindLinks(lemon *lemp)

{
  int iVar1;
  state **ppsVar2;
  state *psVar3;
  config *pcVar4;
  plink *ppVar5;
  long lVar6;
  config *pcVar7;
  plink *ppVar8;
  
  iVar1 = lemp->nstate;
  if (0 < (long)iVar1) {
    ppsVar2 = lemp->sorted;
    lVar6 = 0;
    do {
      psVar3 = ppsVar2[lVar6];
      for (pcVar7 = psVar3->cfp; pcVar7 != (config *)0x0; pcVar7 = pcVar7->next) {
        pcVar7->stp = psVar3;
      }
      lVar6 = lVar6 + 1;
    } while (lVar6 != iVar1);
  }
  if (0 < lemp->nstate) {
    lVar6 = 0;
    do {
      for (pcVar7 = lemp->sorted[lVar6]->cfp; pcVar7 != (config *)0x0; pcVar7 = pcVar7->next) {
        for (ppVar8 = pcVar7->bplp; ppVar8 != (plink *)0x0; ppVar8 = ppVar8->next) {
          pcVar4 = ppVar8->cfp;
          ppVar5 = Plink_new();
          ppVar5->next = pcVar4->fplp;
          pcVar4->fplp = ppVar5;
          ppVar5->cfp = pcVar7;
        }
      }
      lVar6 = lVar6 + 1;
    } while (lVar6 < lemp->nstate);
  }
  return;
}

Assistant:

void FindLinks(struct lemon *lemp)
{
  int i;
  struct config *cfp, *other;
  struct state *stp;
  struct plink *plp;

  /* Housekeeping detail:
  ** Add to every propagate link a pointer back to the state to
  ** which the link is attached. */
  for(i=0; i<lemp->nstate; i++){
    stp = lemp->sorted[i];
    for(cfp=stp->cfp; cfp; cfp=cfp->next){
      cfp->stp = stp;
    }
  }

  /* Convert all backlinks into forward links.  Only the forward
  ** links are used in the follow-set computation. */
  for(i=0; i<lemp->nstate; i++){
    stp = lemp->sorted[i];
    for(cfp=stp->cfp; cfp; cfp=cfp->next){
      for(plp=cfp->bplp; plp; plp=plp->next){
        other = plp->cfp;
        Plink_add(&other->fplp,cfp);
      }
    }
  }
}